

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_decoder.c
# Opt level: O1

lzma_ret block_decode(void *coder_ptr,lzma_allocator *allocator,uint8_t *in,size_t *in_pos,
                     size_t in_size,uint8_t *out,size_t *out_pos,size_t out_size,lzma_action action)

{
  lzma_check type;
  size_t sVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  lzma_bool lVar6;
  lzma_ret lVar7;
  uint32_t uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong size;
  ulong uVar12;
  
  iVar9 = *coder_ptr;
  if (iVar9 == 2) goto LAB_001aee6b;
  if (iVar9 != 1) {
    if (iVar9 != 0) {
      return LZMA_PROG_ERROR;
    }
    sVar1 = *in_pos;
    sVar2 = *out_pos;
    lVar7 = (**(code **)((long)coder_ptr + 0x20))
                      (*(undefined8 *)((long)coder_ptr + 8),allocator,in,in_pos,in_size,out,out_pos,
                       out_size,action);
    uVar10 = *(ulong *)((long)coder_ptr + 0x58);
    uVar11 = *(ulong *)((long)coder_ptr + 0x68);
    if (0x7ffffffffffffffe < uVar11) {
      uVar11 = 0x7fffffffffffffff;
    }
    if (uVar11 - uVar10 < *in_pos - sVar1 || uVar11 < uVar10) {
LAB_001aee0b:
      bVar5 = false;
      lVar7 = LZMA_DATA_ERROR;
    }
    else {
      size = *out_pos - sVar2;
      *(ulong *)((long)coder_ptr + 0x58) = uVar10 + (*in_pos - sVar1);
      uVar10 = *(ulong *)((long)coder_ptr + 0x60);
      uVar11 = *(ulong *)(*(long *)((long)coder_ptr + 0x50) + 0x18);
      uVar12 = 0x7fffffffffffffff;
      if (uVar11 < 0x7fffffffffffffff) {
        uVar12 = uVar11;
      }
      if (uVar12 - uVar10 < size || uVar12 < uVar10) goto LAB_001aee0b;
      *(ulong *)((long)coder_ptr + 0x60) = uVar10 + size;
      if (*(char *)((long)coder_ptr + 0xe0) == '\0') {
        lzma_check_update((lzma_check_state *)((long)coder_ptr + 0x78),
                          *(lzma_check *)(*(long *)((long)coder_ptr + 0x50) + 8),out + sVar2,size);
      }
      if (lVar7 == LZMA_STREAM_END) {
        lVar3 = *(long *)((long)coder_ptr + 0x50);
        if ((*(long *)(lVar3 + 0x10) != -1 &&
             *(long *)(lVar3 + 0x10) != *(long *)((long)coder_ptr + 0x58)) ||
           (lVar4 = *(long *)((long)coder_ptr + 0x60),
           *(long *)(lVar3 + 0x18) != -1 && *(long *)(lVar3 + 0x18) != lVar4)) goto LAB_001aee0b;
        *(long *)(lVar3 + 0x10) = *(long *)((long)coder_ptr + 0x58);
        *(long *)(lVar3 + 0x18) = lVar4;
        *(undefined4 *)coder_ptr = 1;
        bVar5 = true;
        lVar7 = LZMA_DATA_ERROR;
      }
      else {
        bVar5 = false;
      }
    }
    if (!bVar5) {
      return lVar7;
    }
  }
  uVar10 = *(ulong *)((long)coder_ptr + 0x58);
  while ((uVar10 & 3) != 0) {
    uVar11 = *in_pos;
    if (in_size <= uVar11) {
      return LZMA_OK;
    }
    uVar10 = uVar10 + 1;
    *(ulong *)((long)coder_ptr + 0x58) = uVar10;
    *in_pos = uVar11 + 1;
    if (in[uVar11] != '\0') {
      return LZMA_DATA_ERROR;
    }
  }
  type = *(lzma_check *)(*(long *)((long)coder_ptr + 0x50) + 8);
  if (type == LZMA_CHECK_NONE) {
    return LZMA_STREAM_END;
  }
  if (*(char *)((long)coder_ptr + 0xe0) == '\0') {
    lzma_check_finish((lzma_check_state *)((long)coder_ptr + 0x78),type);
  }
  *(undefined4 *)coder_ptr = 2;
LAB_001aee6b:
  lVar3 = *(long *)((long)coder_ptr + 0x50);
  uVar8 = lzma_check_size(*(lzma_check *)(lVar3 + 8));
  uVar10 = (ulong)uVar8;
  lzma_bufcpy(in,in_pos,in_size,(uint8_t *)(lVar3 + 0x28),(size_t *)((long)coder_ptr + 0x70),uVar10)
  ;
  if (*(ulong *)((long)coder_ptr + 0x70) < uVar10) {
    return LZMA_OK;
  }
  if (*(char *)((long)coder_ptr + 0xe0) == '\0') {
    lVar3 = *(long *)((long)coder_ptr + 0x50);
    lVar6 = lzma_check_is_supported(*(lzma_check *)(lVar3 + 8));
    if ((lVar6 != '\0') &&
       (iVar9 = bcmp((void *)(lVar3 + 0x28),(void *)((long)coder_ptr + 0x78),uVar10), iVar9 != 0)) {
      return LZMA_DATA_ERROR;
    }
  }
  return LZMA_STREAM_END;
}

Assistant:

static lzma_ret
block_decode(void *coder_ptr, const lzma_allocator *allocator,
		const uint8_t *restrict in, size_t *restrict in_pos,
		size_t in_size, uint8_t *restrict out,
		size_t *restrict out_pos, size_t out_size, lzma_action action)
{
	lzma_block_coder *coder = coder_ptr;

	switch (coder->sequence) {
	case SEQ_CODE: {
		const size_t in_start = *in_pos;
		const size_t out_start = *out_pos;

		const lzma_ret ret = coder->next.code(coder->next.coder,
				allocator, in, in_pos, in_size,
				out, out_pos, out_size, action);

		const size_t in_used = *in_pos - in_start;
		const size_t out_used = *out_pos - out_start;

		// NOTE: We compare to compressed_limit here, which prevents
		// the total size of the Block growing past LZMA_VLI_MAX.
		if (update_size(&coder->compressed_size, in_used,
					coder->compressed_limit)
				|| update_size(&coder->uncompressed_size,
					out_used,
					coder->block->uncompressed_size))
			return LZMA_DATA_ERROR;

		if (!coder->ignore_check)
			lzma_check_update(&coder->check, coder->block->check,
					out + out_start, out_used);

		if (ret != LZMA_STREAM_END)
			return ret;

		// Compressed and Uncompressed Sizes are now at their final
		// values. Verify that they match the values given to us.
		if (!is_size_valid(coder->compressed_size,
					coder->block->compressed_size)
				|| !is_size_valid(coder->uncompressed_size,
					coder->block->uncompressed_size))
			return LZMA_DATA_ERROR;

		// Copy the values into coder->block. The caller
		// may use this information to construct Index.
		coder->block->compressed_size = coder->compressed_size;
		coder->block->uncompressed_size = coder->uncompressed_size;

		coder->sequence = SEQ_PADDING;
	}

	// Fall through

	case SEQ_PADDING:
		// Compressed Data is padded to a multiple of four bytes.
		while (coder->compressed_size & 3) {
			if (*in_pos >= in_size)
				return LZMA_OK;

			// We use compressed_size here just get the Padding
			// right. The actual Compressed Size was stored to
			// coder->block already, and won't be modified by
			// us anymore.
			++coder->compressed_size;

			if (in[(*in_pos)++] != 0x00)
				return LZMA_DATA_ERROR;
		}

		if (coder->block->check == LZMA_CHECK_NONE)
			return LZMA_STREAM_END;

		if (!coder->ignore_check)
			lzma_check_finish(&coder->check, coder->block->check);

		coder->sequence = SEQ_CHECK;

	// Fall through

	case SEQ_CHECK: {
		const size_t check_size = lzma_check_size(coder->block->check);
		lzma_bufcpy(in, in_pos, in_size, coder->block->raw_check,
				&coder->check_pos, check_size);
		if (coder->check_pos < check_size)
			return LZMA_OK;

		// Validate the Check only if we support it.
		// coder->check.buffer may be uninitialized
		// when the Check ID is not supported.
		if (!coder->ignore_check
				&& lzma_check_is_supported(coder->block->check)
				&& memcmp(coder->block->raw_check,
					coder->check.buffer.u8,
					check_size) != 0)
			return LZMA_DATA_ERROR;

		return LZMA_STREAM_END;
	}
	}

	return LZMA_PROG_ERROR;
}